

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::ImageInfiniteLight::PDF_Le(ImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  Float FVar1;
  undefined8 in_XMM0_Qa;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  Vector3<float> VVar4;
  Tuple2<pbrt::Point2,_float> local_38;
  Tuple3<pbrt::Vector3,_float> local_30;
  undefined1 extraout_var [56];
  
  VVar4 = Transform::ApplyInverse<float>(&(this->super_LightBase).renderFromLight,&ray->d);
  auVar2._0_8_ = VVar4.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
  auVar2._8_4_ = (uint)in_XMM0_Qa ^ 0x80000000;
  auVar2._12_4_ = (uint)((ulong)in_XMM0_Qa >> 0x20) ^ 0x80000000;
  local_30.z = -VVar4.super_Tuple3<pbrt::Vector3,_float>.z;
  local_30._0_8_ = vmovlps_avx(auVar2);
  auVar3._0_8_ = EqualAreaSphereToSquare((Vector3f *)&local_30);
  auVar3._8_56_ = extraout_var;
  local_38 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3._0_16_);
  FVar1 = PiecewiseConstant2D::PDF(&this->distribution,(Point2f *)&local_38);
  *pdfDir = FVar1 / 12.566371;
  *pdfPos = 1.0 / (this->sceneRadius * this->sceneRadius * 3.1415927);
  return;
}

Assistant:

void ImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    Vector3f wl = -renderFromLight.ApplyInverse(ray.d);
    Float mapPDF = distribution.PDF(EqualAreaSphereToSquare(wl));
    *pdfDir = mapPDF / (4 * Pi);
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
}